

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::point3h>
          (Attribute *this,double t,point3h *dst,TimeSampleInterpolationType tinterp)

{
  half hVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::point3h> local_48;
  optional<tinyusdz::value::point3h> local_40;
  optional<tinyusdz::value::point3h> v;
  TimeSampleInterpolationType tinterp_local;
  point3h *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (point3h *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v,t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v);
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::point3h>(&local_48,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::point3h>::
      optional<tinyusdz::value::point3h,_0>(&local_40,&local_48);
      nonstd::optional_lite::optional<tinyusdz::value::point3h>::~optional(&local_48);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_40);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::point3h>::value(&local_40);
        hVar1.value = (pvVar3->y).value;
        dst->x = (half)(pvVar3->x).value;
        dst->y = (half)hVar1.value;
        (dst->z).value = (pvVar3->z).value;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::point3h>::~optional(&local_40);
      if (bVar2) goto LAB_0030462e;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::point3h>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::point3h>(this,dst);
    }
  }
LAB_0030462e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }